

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_mergeBlockDelimiters(ZSTD_Sequence *sequences,size_t seqsSize)

{
  ZSTD_Sequence *pZVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  ZSTD_Sequence *pZVar6;
  
  sVar5 = 0;
  pZVar6 = sequences;
  while (seqsSize != 0) {
    if ((pZVar6->offset == 0) && (pZVar6->matchLength == 0)) {
      if (seqsSize != 1) {
        pZVar6[1].litLength = pZVar6[1].litLength + pZVar6->litLength;
      }
    }
    else {
      uVar2 = pZVar6->litLength;
      uVar3 = pZVar6->matchLength;
      uVar4 = pZVar6->rep;
      pZVar1 = sequences + sVar5;
      pZVar1->offset = pZVar6->offset;
      pZVar1->litLength = uVar2;
      pZVar1->matchLength = uVar3;
      pZVar1->rep = uVar4;
      sVar5 = sVar5 + 1;
    }
    pZVar6 = pZVar6 + 1;
    seqsSize = seqsSize - 1;
  }
  return sVar5;
}

Assistant:

size_t ZSTD_mergeBlockDelimiters(ZSTD_Sequence* sequences, size_t seqsSize) {
    size_t in = 0;
    size_t out = 0;
    for (; in < seqsSize; ++in) {
        if (sequences[in].offset == 0 && sequences[in].matchLength == 0) {
            if (in != seqsSize - 1) {
                sequences[in+1].litLength += sequences[in].litLength;
            }
        } else {
            sequences[out] = sequences[in];
            ++out;
        }
    }
    return out;
}